

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

iterator __thiscall
google::protobuf::RepeatedField<double>::erase(RepeatedField<double> *this,const_iterator position)

{
  void *__dest;
  LogMessage *other;
  int iVar1;
  void *pvVar2;
  size_t __n;
  long lVar3;
  int iVar4;
  LogMessage local_68;
  LogFinisher local_29;
  
  pvVar2 = this->arena_or_elements_;
  iVar1 = this->current_size_;
  lVar3 = (long)(int)((ulong)((long)position - (long)pvVar2) >> 3);
  __dest = (void *)((long)pvVar2 + lVar3 * 8);
  __n = (long)pvVar2 + ((long)iVar1 * 8 - (long)(position + 1));
  if (__n != 0) {
    memmove(__dest,position + 1,__n);
    pvVar2 = this->arena_or_elements_;
    iVar1 = this->current_size_;
  }
  iVar4 = (int)((long)__dest + (__n - (long)pvVar2) >> 3);
  if (iVar1 < iVar4) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x63d);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (new_size) <= (current_size_): ");
    internal::LogFinisher::operator=(&local_29,other);
    internal::LogMessage::~LogMessage(&local_68);
    iVar1 = this->current_size_;
  }
  if (0 < iVar1) {
    this->current_size_ = iVar4;
  }
  return (iterator)(lVar3 * 8 + (long)this->arena_or_elements_);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator position) {
  return erase(position, position + 1);
}